

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Kernel * anon_unknown.dwarf_114952::SumKernel::create
                   (string *def,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  SumKernel *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  string *def_local;
  
  this = (SumKernel *)operator_new(0x60);
  SumKernel(this,def,args);
  return &this->super_Kernel;
}

Assistant:

static Kernel* create(const std::string& def, const std::vector<std::string>& args)
    {
        return new SumKernel(def, args);
    }